

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unity.c
# Opt level: O2

void UnityPrintNumberHex(UNITY_UINT number,char nibbles_to_print)

{
  byte bVar1;
  uint uVar2;
  int __c;
  long lVar3;
  ulong uVar4;
  
  bVar1 = 0x10;
  if ((byte)nibbles_to_print < 0x10) {
    bVar1 = nibbles_to_print;
  }
  uVar4 = (ulong)bVar1;
  lVar3 = uVar4 * 4;
  while (lVar3 = lVar3 + -4, 0 < (long)uVar4) {
    uVar4 = uVar4 - 1;
    uVar2 = (uint)(number >> ((byte)lVar3 & 0x3f)) & 0xf;
    __c = uVar2 + 0x30;
    if (9 < uVar2) {
      __c = uVar2 + 0x37;
    }
    putchar(__c);
  }
  return;
}

Assistant:

void UnityPrintNumberHex(const UNITY_UINT number, const char nibbles_to_print)
{
    int nibble;
    char nibbles = nibbles_to_print;

    if ((unsigned)nibbles > UNITY_MAX_NIBBLES)
    {
        nibbles = UNITY_MAX_NIBBLES;
    }

    while (nibbles > 0)
    {
        nibbles--;
        nibble = (int)(number >> (nibbles * 4)) & 0x0F;
        if (nibble <= 9)
        {
            UNITY_OUTPUT_CHAR((char)('0' + nibble));
        }
        else
        {
            UNITY_OUTPUT_CHAR((char)('A' - 10 + nibble));
        }
    }
}